

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# am_value.cpp
# Opt level: O2

bool __thiscall Am_Value::Exists(Am_Value *this)

{
  switch(*(uint *)this >> 0xc & 7) {
  case 0:
    return (short)*(uint *)this != 0;
  case 1:
    return false;
  default:
    return true;
  }
}

Assistant:

bool
Am_Value::Exists() const
{
  switch (Am_Type_Class(type)) {
  case Am_ERROR_VALUE_TYPE:
    return false;
  case Am_WRAPPER:
  case Am_ENUM:
    return true;
  case Am_SIMPLE_TYPE:
    switch (type) {
    case Am_NONE:
      return false;
    default:
      return true;
    }
  default:
    return true;
  }
}